

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateStructors
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  long lVar2;
  FileDescriptor *pFVar3;
  undefined8 *puVar4;
  Descriptor *in_RDX;
  FieldDescriptor *field;
  string *psVar5;
  long lVar6;
  int i;
  long lVar7;
  allocator<char> local_a9;
  MessageGenerator *local_a8;
  string local_a0;
  string *local_80;
  Printer *local_78;
  string local_70;
  string superclass;
  
  SuperClassName_abi_cxx11_(&superclass,(cpp *)this->descriptor_,in_RDX);
  psVar5 = &this->classname_;
  local_a8 = this;
  io::Printer::Print(printer,
                     "$classname$::$classname$()\n  : $superclass$() {\n  SharedCtor();\n}\n",
                     "classname",psVar5,"superclass",&superclass);
  io::Printer::Print(printer,"\nvoid $classname$::InitAsDefaultInstance() {\n","classname",psVar5);
  lVar6 = 0;
  local_80 = psVar5;
  local_78 = printer;
  for (lVar7 = 0; pDVar1 = local_a8->descriptor_, lVar7 < *(int *)(pDVar1 + 0x2c); lVar7 = lVar7 + 1
      ) {
    lVar2 = *(long *)(pDVar1 + 0x30);
    if ((*(int *)(lVar2 + 0x30 + lVar6) != 3) &&
       (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar2 + 0x2c + lVar6) * 4) ==
        10)) {
      pFVar3 = *(FileDescriptor **)(pDVar1 + 0x10);
      FieldName_abi_cxx11_
                (&local_a0,(cpp *)(lVar2 + lVar6),
                 (FieldDescriptor *)FieldDescriptor::kTypeToCppTypeMap);
      FieldMessageTypeName_abi_cxx11_(&local_70,(cpp *)(lVar2 + lVar6),field);
      printer = local_78;
      PrintHandlingOptionalStaticInitializers
                (pFVar3,local_78,"  $name$_ = const_cast< $type$*>(&$type$::default_instance());\n",
                 "  $name$_ = const_cast< $type$*>(\n      $type$::internal_default_instance());\n",
                 "name",&local_a0,"type",&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    lVar6 = lVar6 + 0x78;
  }
  io::Printer::Print(printer,"}\n\n");
  psVar5 = local_80;
  io::Printer::Print(printer,
                     "$classname$::$classname$(const $classname$& from)\n  : $superclass$() {\n  SharedCtor();\n  MergeFrom(from);\n}\n\n"
                     ,"classname",local_80,"superclass",&superclass);
  GenerateSharedConstructorCode(local_a8,printer);
  io::Printer::Print(printer,"$classname$::~$classname$() {\n  SharedDtor();\n}\n\n","classname",
                     psVar5);
  GenerateSharedDestructorCode(local_a8,printer);
  io::Printer::Print(printer,
                     "void $classname$::SetCachedSize(int size) const {\n  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n  _cached_size_ = size;\n  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n}\n"
                     ,"classname",psVar5);
  puVar4 = *(undefined8 **)(local_a8->descriptor_ + 0x10);
  if ((*(int *)(puVar4[0x11] + 0x50) != 3) &&
     (*(char *)(*(long *)(local_a8->descriptor_ + 0x20) + 0x59) == '\0')) {
    GlobalAddDescriptorsName(&local_a0,(string *)*puVar4);
    io::Printer::Print(printer,
                       "const ::google::protobuf::Descriptor* $classname$::descriptor() {\n  protobuf_AssignDescriptorsOnce();\n  return $classname$_descriptor_;\n}\n\n"
                       ,"classname",psVar5,"adddescriptorsname",&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  io::Printer::Print(printer,"const $classname$& $classname$::default_instance() {\n","classname",
                     psVar5);
  pFVar3 = *(FileDescriptor **)(local_a8->descriptor_ + 0x10);
  GlobalAddDescriptorsName(&local_a0,*(string **)pFVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_a9);
  PrintHandlingOptionalStaticInitializers
            (pFVar3,printer,"  if (default_instance_ == NULL) $adddescriptorsname$();\n",
             "  $adddescriptorsname$();\n","adddescriptorsname",&local_a0,(char *)0x0,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_a0);
  GlobalAddDescriptorsName(&local_a0,(string *)**(undefined8 **)(local_a8->descriptor_ + 0x10));
  io::Printer::Print(printer,
                     "  return *default_instance_;\n}\n\n$classname$* $classname$::default_instance_ = NULL;\n\n$classname$* $classname$::New() const {\n  return new $classname$;\n}\n"
                     ,"classname",psVar5,"adddescriptorsname",&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&superclass);
  return;
}

Assistant:

void MessageGenerator::
GenerateStructors(io::Printer* printer) {
  string superclass = SuperClassName(descriptor_);

  // Generate the default constructor.
  printer->Print(
    "$classname$::$classname$()\n"
    "  : $superclass$() {\n"
    "  SharedCtor();\n"
    "}\n",
    "classname", classname_,
    "superclass", superclass);

  printer->Print(
    "\n"
    "void $classname$::InitAsDefaultInstance() {\n",
    "classname", classname_);

  // The default instance needs all of its embedded message pointers
  // cross-linked to other default instances.  We can't do this initialization
  // in the constructor because some other default instances may not have been
  // constructed yet at that time.
  // TODO(kenton):  Maybe all message fields (even for non-default messages)
  //   should be initialized to point at default instances rather than NULL?
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      PrintHandlingOptionalStaticInitializers(
        descriptor_->file(), printer,
        // With static initializers.
        "  $name$_ = const_cast< $type$*>(&$type$::default_instance());\n",
        // Without.
        "  $name$_ = const_cast< $type$*>(\n"
        "      $type$::internal_default_instance());\n",
        // Vars.
        "name", FieldName(field),
        "type", FieldMessageTypeName(field));
    }
  }
  printer->Print(
    "}\n"
    "\n");

  // Generate the copy constructor.
  printer->Print(
    "$classname$::$classname$(const $classname$& from)\n"
    "  : $superclass$() {\n"
    "  SharedCtor();\n"
    "  MergeFrom(from);\n"
    "}\n"
    "\n",
    "classname", classname_,
    "superclass", superclass);

  // Generate the shared constructor code.
  GenerateSharedConstructorCode(printer);

  // Generate the destructor.
  printer->Print(
    "$classname$::~$classname$() {\n"
    "  SharedDtor();\n"
    "}\n"
    "\n",
    "classname", classname_);

  // Generate the shared destructor code.
  GenerateSharedDestructorCode(printer);

  // Generate SetCachedSize.
  printer->Print(
    "void $classname$::SetCachedSize(int size) const {\n"
    "  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
    "  _cached_size_ = size;\n"
    "  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
    "}\n",
    "classname", classname_);

  // Only generate this member if it's not disabled.
  if (HasDescriptorMethods(descriptor_->file()) &&
      !descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(
      "const ::google::protobuf::Descriptor* $classname$::descriptor() {\n"
      "  protobuf_AssignDescriptorsOnce();\n"
      "  return $classname$_descriptor_;\n"
      "}\n"
      "\n",
      "classname", classname_,
      "adddescriptorsname",
      GlobalAddDescriptorsName(descriptor_->file()->name()));
  }

  printer->Print(
    "const $classname$& $classname$::default_instance() {\n",
    "classname", classname_);

  PrintHandlingOptionalStaticInitializers(
    descriptor_->file(), printer,
    // With static initializers.
    "  if (default_instance_ == NULL) $adddescriptorsname$();\n",
    // Without.
    "  $adddescriptorsname$();\n",
    // Vars.
    "adddescriptorsname",
    GlobalAddDescriptorsName(descriptor_->file()->name()));

  printer->Print(
    "  return *default_instance_;\n"
    "}\n"
    "\n"
    "$classname$* $classname$::default_instance_ = NULL;\n"
    "\n"
    "$classname$* $classname$::New() const {\n"
    "  return new $classname$;\n"
    "}\n",
    "classname", classname_,
    "adddescriptorsname",
    GlobalAddDescriptorsName(descriptor_->file()->name()));
}